

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

int __thiscall capnp::DynamicStruct::Builder::init(Builder *this,EVP_PKEY_CTX *ctx)

{
  Builder value;
  ListBuilder builder;
  ListBuilder builder_00;
  Builder value_00;
  Builder value_01;
  ListSchema schema;
  ListSchema schema_00;
  Type TVar1;
  bool bVar2;
  ElementSize elementSize;
  Which WVar3;
  Which WVar4;
  uint32_t uVar5;
  StructPointerOffset SVar6;
  uint uVar7;
  uint in_EDX;
  Builder value_02;
  undefined1 in_stack_00000008 [64];
  Fault local_298;
  Fault f_2;
  Fault local_288;
  Fault f_1;
  PointerBuilder local_258;
  Builder local_240;
  PointerBuilder local_228;
  ListBuilder local_210;
  Type local_1e8;
  Builder local_1d8;
  Schema local_1a0;
  StructSize local_194;
  PointerBuilder local_190;
  ListBuilder local_178;
  Type local_150;
  Builder local_140;
  undefined1 local_108 [8];
  ListSchema listType;
  Reader slot;
  Type type;
  Reader proto;
  Fault local_30;
  Fault f;
  uint size_local;
  Builder *this_local;
  
  f.exception = (Exception *)StructSchema::Field::getContainingStruct((Field *)&stack0x00000008);
  bVar2 = Schema::operator==((Schema *)&f,(Schema *)ctx);
  if (!bVar2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x2c3,FAILED,"field.getContainingStruct() == schema",
               "\"`field` is not a field of this struct.\"",
               (char (*) [39])"`field` is not a field of this struct.");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  setInUnion((Builder *)ctx,(Field)in_stack_00000008);
  StructSchema::Field::getProto((Reader *)&type.field_4,(Field *)&stack0x00000008);
  join_0x00000010_0x00000000_ = StructSchema::Field::getType((Field *)&stack0x00000008);
  WVar3 = capnp::schema::Field::Reader::which((Reader *)&type.field_4);
  if (WVar3 != SLOT) {
    if (WVar3 != GROUP) {
      kj::_::unreachable();
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[63]>
              (&local_298,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x2eb,FAILED,(char *)0x0,
               "\"init() with size is only valid for list, text, or data fields.\"",
               (char (*) [63])"init() with size is only valid for list, text, or data fields.");
    kj::_::Debug::Fault::fatal(&local_298);
  }
  capnp::schema::Field::Reader::getSlot
            ((Reader *)&listType.elementType.field_4,(Reader *)&type.field_4);
  WVar4 = capnp::Type::which((Type *)&slot._reader.nestingLimit);
  if (WVar4 == TEXT) {
    uVar5 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&listType.elementType.field_4);
    SVar6 = assumePointerOffset(uVar5);
    _::StructBuilder::getPointerField(&local_258,(StructBuilder *)(ctx + 8),SVar6);
    uVar7 = bounded<unsigned_int>(in_EDX);
    _::PointerBuilder::initBlob<capnp::Text>(&local_240,&local_258,uVar7);
    value.content.ptr = local_240.content.ptr;
    value._0_8_ = local_240._0_8_;
    value.content.size_ = local_240.content.size_;
    DynamicValue::Builder::Builder((Builder *)this,value);
  }
  else if (WVar4 == DATA) {
    uVar5 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&listType.elementType.field_4);
    SVar6 = assumePointerOffset(uVar5);
    _::StructBuilder::getPointerField((PointerBuilder *)&f_1,(StructBuilder *)(ctx + 8),SVar6);
    uVar7 = bounded<unsigned_int>(in_EDX);
    value_02 = _::PointerBuilder::initBlob<capnp::Data>((PointerBuilder *)&f_1,uVar7);
    DynamicValue::Builder::Builder((Builder *)this,value_02);
  }
  else {
    if (WVar4 != LIST) {
      WVar4 = capnp::Type::which((Type *)&slot._reader.nestingLimit);
      f_2.exception._4_4_ = (uint)WVar4;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[63],unsigned_int>
                (&local_288,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x2e4,FAILED,(char *)0x0,
                 "\"init() with size is only valid for list, text, or data fields.\", (uint)type.which()"
                 ,(char (*) [63])"init() with size is only valid for list, text, or data fields.",
                 (uint *)((long)&f_2.exception + 4));
      kj::_::Debug::Fault::fatal(&local_288);
    }
    _local_108 = (Type)capnp::Type::asList((Type *)&slot._reader.nestingLimit);
    WVar4 = ListSchema::whichElementType((ListSchema *)local_108);
    TVar1 = _local_108;
    _local_108 = TVar1;
    if (WVar4 == STRUCT) {
      local_150.baseType = local_108._0_2_;
      local_150.listDepth = local_108[2];
      local_150.isImplicitParam = (bool)local_108[3];
      local_150.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_108._4_2_;
      local_150._6_2_ = local_108._6_2_;
      local_150.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)listType.elementType._0_8_;
      uVar5 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&listType.elementType.field_4)
      ;
      SVar6 = assumePointerOffset(uVar5);
      _::StructBuilder::getPointerField(&local_190,(StructBuilder *)(ctx + 8),SVar6);
      uVar7 = bounded<unsigned_int>(in_EDX);
      local_1a0.raw = (RawBrandedSchema *)ListSchema::getStructElementType((ListSchema *)local_108);
      local_194 = anon_unknown_70::structSizeFromSchema((StructSchema)local_1a0.raw);
      _::PointerBuilder::initStructList(&local_178,&local_190,uVar7,local_194);
      schema_00.elementType.field_4.schema = local_150.field_4.schema;
      schema_00.elementType.baseType = local_150.baseType;
      schema_00.elementType.listDepth = local_150.listDepth;
      schema_00.elementType.isImplicitParam = local_150.isImplicitParam;
      schema_00.elementType.field_3 = local_150.field_3;
      schema_00.elementType._6_2_ = local_150._6_2_;
      builder.capTable = local_178.capTable;
      builder.segment = local_178.segment;
      builder.ptr = local_178.ptr;
      builder.elementCount = local_178.elementCount;
      builder.step = local_178.step;
      builder.structDataSize = local_178.structDataSize;
      builder.structPointerCount = local_178.structPointerCount;
      builder.elementSize = local_178.elementSize;
      builder._39_1_ = local_178._39_1_;
      DynamicList::Builder::Builder(&local_140,schema_00,builder);
      value_00.schema.elementType.field_4.schema = local_140.schema.elementType.field_4.schema;
      value_00.schema.elementType.baseType = local_140.schema.elementType.baseType;
      value_00.schema.elementType.listDepth = local_140.schema.elementType.listDepth;
      value_00.schema.elementType.isImplicitParam = local_140.schema.elementType.isImplicitParam;
      value_00.schema.elementType.field_3 = local_140.schema.elementType.field_3;
      value_00.schema.elementType._6_2_ = local_140.schema.elementType._6_2_;
      value_00.builder.segment = local_140.builder.segment;
      value_00.builder.capTable = local_140.builder.capTable;
      value_00.builder.ptr = local_140.builder.ptr;
      value_00.builder.elementCount = local_140.builder.elementCount;
      value_00.builder.step = local_140.builder.step;
      value_00.builder.structDataSize = local_140.builder.structDataSize;
      value_00.builder.structPointerCount = local_140.builder.structPointerCount;
      value_00.builder.elementSize = local_140.builder.elementSize;
      value_00.builder._39_1_ = local_140.builder._39_1_;
      DynamicValue::Builder::Builder((Builder *)this,value_00);
    }
    else {
      local_1e8.baseType = local_108._0_2_;
      local_1e8.listDepth = local_108[2];
      local_1e8.isImplicitParam = (bool)local_108[3];
      local_1e8.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_108._4_2_;
      local_1e8._6_2_ = local_108._6_2_;
      local_1e8.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)listType.elementType._0_8_;
      uVar5 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&listType.elementType.field_4)
      ;
      SVar6 = assumePointerOffset(uVar5);
      _::StructBuilder::getPointerField(&local_228,(StructBuilder *)(ctx + 8),SVar6);
      WVar4 = ListSchema::whichElementType((ListSchema *)local_108);
      elementSize = anon_unknown_70::elementSizeFor(WVar4);
      uVar7 = bounded<unsigned_int>(in_EDX);
      _::PointerBuilder::initList(&local_210,&local_228,elementSize,uVar7);
      schema.elementType.field_4.schema = local_1e8.field_4.schema;
      schema.elementType.baseType = local_1e8.baseType;
      schema.elementType.listDepth = local_1e8.listDepth;
      schema.elementType.isImplicitParam = local_1e8.isImplicitParam;
      schema.elementType.field_3 = local_1e8.field_3;
      schema.elementType._6_2_ = local_1e8._6_2_;
      builder_00.capTable = local_210.capTable;
      builder_00.segment = local_210.segment;
      builder_00.ptr = local_210.ptr;
      builder_00.elementCount = local_210.elementCount;
      builder_00.step = local_210.step;
      builder_00.structDataSize = local_210.structDataSize;
      builder_00.structPointerCount = local_210.structPointerCount;
      builder_00.elementSize = local_210.elementSize;
      builder_00._39_1_ = local_210._39_1_;
      DynamicList::Builder::Builder(&local_1d8,schema,builder_00);
      value_01.schema.elementType.field_4.schema = local_1d8.schema.elementType.field_4.schema;
      value_01.schema.elementType.baseType = local_1d8.schema.elementType.baseType;
      value_01.schema.elementType.listDepth = local_1d8.schema.elementType.listDepth;
      value_01.schema.elementType.isImplicitParam = local_1d8.schema.elementType.isImplicitParam;
      value_01.schema.elementType.field_3 = local_1d8.schema.elementType.field_3;
      value_01.schema.elementType._6_2_ = local_1d8.schema.elementType._6_2_;
      value_01.builder.segment = local_1d8.builder.segment;
      value_01.builder.capTable = local_1d8.builder.capTable;
      value_01.builder.ptr = local_1d8.builder.ptr;
      value_01.builder.elementCount = local_1d8.builder.elementCount;
      value_01.builder.step = local_1d8.builder.step;
      value_01.builder.structDataSize = local_1d8.builder.structDataSize;
      value_01.builder.structPointerCount = local_1d8.builder.structPointerCount;
      value_01.builder.elementSize = local_1d8.builder.elementSize;
      value_01.builder._39_1_ = local_1d8.builder._39_1_;
      DynamicValue::Builder::Builder((Builder *)this,value_01);
    }
  }
  return (int)this;
}

Assistant:

DynamicValue::Builder DynamicStruct::Builder::init(StructSchema::Field field, uint size) {
  KJ_REQUIRE(field.getContainingStruct() == schema, "`field` is not a field of this struct.");
  setInUnion(field);

  auto proto = field.getProto();
  auto type = field.getType();

  switch (proto.which()) {
    case schema::Field::SLOT: {
      auto slot = proto.getSlot();
      switch (type.which()) {
        case schema::Type::LIST: {
          auto listType = type.asList();
          if (listType.whichElementType() == schema::Type::STRUCT) {
            return DynamicList::Builder(listType,
                builder.getPointerField(assumePointerOffset(slot.getOffset()))
                       .initStructList(bounded(size) * ELEMENTS,
                                       structSizeFromSchema(listType.getStructElementType())));
          } else {
            return DynamicList::Builder(listType,
                builder.getPointerField(assumePointerOffset(slot.getOffset()))
                       .initList(elementSizeFor(listType.whichElementType()),
                                 bounded(size) * ELEMENTS));
          }
        }
        case schema::Type::TEXT:
          return builder.getPointerField(assumePointerOffset(slot.getOffset()))
                        .initBlob<Text>(bounded(size) * BYTES);
        case schema::Type::DATA:
          return builder.getPointerField(assumePointerOffset(slot.getOffset()))
                        .initBlob<Data>(bounded(size) * BYTES);
        default:
          KJ_FAIL_REQUIRE(
              "init() with size is only valid for list, text, or data fields.",
              (uint)type.which());
          break;
      }
      KJ_UNREACHABLE;
    }

    case schema::Field::GROUP:
      KJ_FAIL_REQUIRE("init() with size is only valid for list, text, or data fields.");
  }

  KJ_UNREACHABLE;
}